

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void log_log(int level,char *file,int line,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar2;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  log_Event local_178;
  char local_f8 [16];
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_178.ap[0].reg_save_area = (undefined1 *)0x0;
  local_178.time = (tm *)0x0;
  local_178.time_buf.tm_zone = (char *)0x0;
  local_178.udata = (FILE *)0x0;
  local_178.time_buf.tm_isdst = 0;
  local_178.time_buf._36_4_ = 0;
  local_178.time_buf.tm_gmtoff = 0;
  local_178.time_buf.tm_mon = 0;
  local_178.time_buf.tm_year = 0;
  local_178.time_buf.tm_wday = 0;
  local_178.time_buf.tm_yday = 0;
  local_178.time_buf.tm_sec = 0;
  local_178.time_buf.tm_min = 0;
  local_178.time_buf.tm_hour = 0;
  local_178.time_buf.tm_mday = 0;
  local_178.ap[0].gp_offset = 0;
  local_178.ap[0].fp_offset = 0;
  local_178.ap[0].overflow_arg_area = (undefined1 *)0x0;
  local_178.fmt = fmt;
  local_178.file = file;
  local_178.line = line;
  local_178.level = level;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (L.lock != (log_LockFn)0x0) {
    (*L.lock)(true,L.udata);
  }
  if ((L.quiet == false) && (L.level <= level)) {
    init_event(&local_178,_stderr);
    local_178.ap[0].reg_save_area = local_e8;
    local_178.ap[0].overflow_arg_area = &stack0x00000008;
    local_178.ap[0].gp_offset = 0x20;
    local_178.ap[0].fp_offset = 0x30;
    sVar1 = strftime(local_f8,0x10,"%H:%M:%S",(tm *)local_178.time);
    local_f8[sVar1] = '\0';
    fprintf((FILE *)local_178.udata,"%s %-7s %s:%d: ",local_f8,
            level_strings[(local_178.level + 0x20) / 0x20],local_178.file,
            (ulong)(uint)local_178.line);
    vfprintf((FILE *)local_178.udata,local_178.fmt,&local_178);
    fputc(10,(FILE *)local_178.udata);
    fflush((FILE *)local_178.udata);
  }
  for (lVar2 = 0; (lVar2 != 0x300 && (*(long *)((long)&L.callbacks[0].fn + lVar2) != 0));
      lVar2 = lVar2 + 0x18) {
    if (*(int *)((long)&L.callbacks[0].level + lVar2) <= level) {
      init_event(&local_178,*(void **)((long)&L.callbacks[0].udata + lVar2));
      local_178.ap[0].gp_offset = 0x20;
      local_178.ap[0].fp_offset = 0x30;
      local_178.ap[0].overflow_arg_area = &stack0x00000008;
      local_178.ap[0].reg_save_area = local_e8;
      (**(code **)((long)&L.callbacks[0].fn + lVar2))();
    }
  }
  if (L.lock != (log_LockFn)0x0) {
    (*L.lock)(false,L.udata);
  }
  return;
}

Assistant:

void log_log(int level, const char *file, int line, const char *fmt, ...) {
    log_Event ev = {
        .fmt = fmt,
        .file = file,
        .line = line,
        .level = level,
    };

    lock();

    if (!L.quiet && level >= L.level) {
        init_event(&ev, stderr);
        va_start(ev.ap, fmt);
        stdout_callback(&ev);
        va_end(ev.ap);
    }

    for (int i = 0; i < MAX_CALLBACKS && L.callbacks[i].fn; i++) {
        Callback *cb = &L.callbacks[i];
        if (level >= cb->level) {
            init_event(&ev, cb->udata);
            va_start(ev.ap, fmt);
            cb->fn(&ev);
            va_end(ev.ap);
        }
    }

    unlock();
}